

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O2

void __thiscall
vsencoding::VSEncodingBlocks::encodeVS
          (VSEncodingBlocks *this,uint32_t len,uint32_t *in,uint32_t *size,uint32_t *out)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint32_t *seq;
  ulong uVar4;
  uint32_t *puVar5;
  BitsWriter *this_00;
  long lVar6;
  uint32_t *puVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  uint32_t value;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t numBlocks;
  uint32_t *local_148;
  uint32_t *local_140;
  uint32_t countBlocksLogs [16];
  uint32_t blockCur [16];
  uint32_t *blocks [16];
  
  local_148 = size;
  seq = (uint32_t *)operator_new__((ulong)len * 4);
  for (uVar4 = 0; len != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = in[uVar4];
    uVar13 = 1;
    if (uVar3 != 0) {
      iVar8 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      uVar13 = (ulong)(iVar8 + 2);
    }
    seq[uVar4] = *(uint32_t *)(__vseblocks_remapLogs + uVar13 * 4);
  }
  puVar5 = VSEncoding::compute_OptPartition(__vseblocks,seq,len,8,&numBlocks);
  this_00 = (BitsWriter *)operator_new(0x20);
  this_00->data = out;
  this_00->Fill = 0;
  this_00->buffer = 0;
  this_00->written = 0;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    countBlocksLogs[lVar6] = 0;
    blockCur[lVar6] = 0;
  }
  uVar4 = 0;
  while (uVar4 != numBlocks) {
    puVar1 = puVar5 + uVar4;
    lVar6 = uVar4 + 1;
    uVar4 = uVar4 + 1;
    uVar9 = 0;
    for (uVar13 = (ulong)*puVar1; uVar13 < puVar5[lVar6]; uVar13 = uVar13 + 1) {
      if ((uint)uVar9 <= seq[uVar13]) {
        uVar9 = (ulong)seq[uVar13];
      }
    }
    countBlocksLogs[*(uint *)(__vseblocks_codeLogs + uVar9 * 4)] =
         countBlocksLogs[*(uint *)(__vseblocks_codeLogs + uVar9 * 4)] + (puVar5[lVar6] - *puVar1);
  }
  value = 0;
  for (lVar6 = 1; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    value = (value + 1) - (uint)(countBlocksLogs[lVar6] == 0);
  }
  BitsWriter::bit_writer(this_00,value,0x20);
  for (lVar6 = 1; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    if (countBlocksLogs[lVar6] != 0) {
      BitsWriter::bit_writer(this_00,countBlocksLogs[lVar6],0x1c);
      BitsWriter::bit_writer(this_00,(uint32_t)lVar6,4);
    }
  }
  blocks[0] = (uint32_t *)0x0;
  for (lVar6 = 1; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    if ((ulong)countBlocksLogs[lVar6] == 0) {
      puVar7 = (uint32_t *)0x0;
    }
    else {
      puVar7 = (uint32_t *)operator_new__((ulong)countBlocksLogs[lVar6] << 2);
    }
    blocks[lVar6] = puVar7;
  }
  uVar4 = 0;
  while (uVar13 = uVar4, uVar13 < numBlocks) {
    uVar11 = (ulong)puVar5[uVar13 + 1];
    uVar12 = 0;
    uVar9 = (ulong)puVar5[uVar13];
    for (uVar4 = uVar9; uVar4 < uVar11; uVar4 = uVar4 + 1) {
      if ((uint)uVar12 <= seq[uVar4]) {
        uVar12 = (ulong)seq[uVar4];
      }
    }
    uVar4 = uVar13 + 1;
    if ((uint)uVar12 != 0) {
      for (; uVar9 < uVar11; uVar9 = uVar9 + 1) {
        uVar3 = *(uint *)(__vseblocks_codeLogs + uVar12 * 4);
        uVar2 = blockCur[uVar3];
        blocks[uVar3][uVar2] = in[uVar9];
        blockCur[uVar3] = uVar2 + 1;
        uVar11 = (ulong)puVar5[uVar13 + 1];
      }
    }
  }
  local_140 = puVar5;
  for (lVar6 = 1; puVar5 = local_140, lVar6 != 0x10; lVar6 = lVar6 + 1) {
    uVar3 = countBlocksLogs[lVar6];
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      BitsWriter::bit_writer
                (this_00,blocks[lVar6][uVar4],*(uint32_t *)(__vseblocks_possLogs + lVar6 * 4));
    }
    if ((ulong)uVar3 != 0) {
      BitsWriter::bit_flush(this_00);
    }
  }
  BitsWriter::bit_flush(this_00);
  uVar4 = 0;
  do {
    if (numBlocks <= uVar4) {
      BitsWriter::bit_flush(this_00);
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        if (blocks[lVar6] != (uint32_t *)0x0) {
          operator_delete__(blocks[lVar6]);
        }
      }
      if (puVar5 != (uint32_t *)0x0) {
        operator_delete__(puVar5);
      }
      operator_delete__(seq);
      *local_148 = this_00->written;
      operator_delete(this_00);
      return;
    }
    puVar1 = puVar5 + uVar4;
    lVar6 = uVar4 + 1;
    uVar4 = uVar4 + 1;
    uVar3 = 0;
    for (uVar13 = (ulong)*puVar1; uVar13 < puVar5[lVar6]; uVar13 = uVar13 + 1) {
      if (uVar3 <= seq[uVar13]) {
        uVar3 = seq[uVar13];
      }
    }
    iVar8 = puVar5[lVar6] - *puVar1;
    if (uVar3 == 0) {
      piVar10 = &__vseblocks_posszLens;
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        if (iVar8 == *piVar10) goto LAB_0010e625;
        piVar10 = piVar10 + 1;
      }
    }
    else {
      piVar10 = &__vseblocks_possLens;
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        if (iVar8 == *piVar10) goto LAB_0010e625;
        piVar10 = piVar10 + 1;
      }
    }
    lVar6 = 0x10;
LAB_0010e625:
    BitsWriter::bit_writer(this_00,*(uint32_t *)(__vseblocks_codeLogs + (ulong)uVar3 * 4),4);
    BitsWriter::bit_writer(this_00,(uint32_t)lVar6,4);
  } while( true );
}

Assistant:

inline void VSEncodingBlocks::encodeVS(uint32_t len, const uint32_t *in,
                                uint32_t &size, uint32_t *out) {
  uint32_t i;
  uint32_t j;
  uint32_t *logs;
  uint32_t numBlocks;
  uint32_t maxB;
  uint32_t ntotal;
  uint32_t *part;
  uint32_t *blocks[VSEBLOCKS_LOGS_LEN];
  uint32_t blockCur[VSEBLOCKS_LOGS_LEN];
  uint32_t countBlocksLogs[VSEBLOCKS_LOGS_LEN];
  BitsWriter *wt;

  logs = new uint32_t[len];

  if (logs == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  /* Compute logs of all numbers */
  for (i = 0; i < len; i++)
    logs[i] = __vseblocks_remapLogs[1 + asmbits(in[i])];

  /* Compute optimal partition */
  part = __vseblocks->compute_OptPartition(
      logs, len, VSEBLOCKS_LOGLEN + VSEBLOCKS_LOGLOG, numBlocks);

  /* Ready to write */
  wt = new BitsWriter(out);

  if (wt == NULL)
    fprintf(stderr, "Can't initialize a class\n");

  /* countBlocksLogs[i] says how many blocks uses i bits */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++) {
    countBlocksLogs[i] = 0;
    blockCur[i] = 0;
  }

  /* Count number of occs of each log */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    countBlocksLogs[__vseblocks_codeLogs[maxB]] += part[i + 1] - part[i];
  }

  for (ntotal = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++)
    if (countBlocksLogs[i] > 0)
      ntotal++;

  /* Write occs. zero is assumed to be present */
  wt->bit_writer(ntotal, 32);

  /* For each logs write it and the number of its occurrences */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      wt->bit_writer(countBlocksLogs[i], 28);
      wt->bit_writer(i, 4);
    }
  }

  /* Prepare arrays to store groups of elements */
  for (blocks[0] = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      blocks[i] = new uint32_t[countBlocksLogs[i]];

      if (blocks[i] == NULL)
        fprintf(stderr, "Can't allocate memory\n");
    } else {
      blocks[i] = NULL;
    }
  }

  /* Permute the elements based on their values of B */
  for (i = 0; i < numBlocks; i++) {
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    if (!maxB)
      continue;

    for (j = part[i]; j < part[i + 1]; j++) {
      /* Save current element in its bucket */
      blocks[__vseblocks_codeLogs[maxB]][blockCur[__vseblocks_codeLogs[maxB]]] =
          in[j];
      blockCur[__vseblocks_codeLogs[maxB]]++;
    }
  }

  /* Write each bucket ... keeping byte alligment */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    for (j = 0; j < countBlocksLogs[i]; j++)
      wt->bit_writer(blocks[i][j], __vseblocks_possLogs[i]);

    /* Align to next word */
    if (countBlocksLogs[i] > 0)
      wt->bit_flush();
  }

  wt->bit_flush();

  /* write block codes... a byte each */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (j = part[i], maxB = 0; j < part[i + 1]; j++) {
      if (maxB < logs[j])
        maxB = logs[j];
    }

    if (maxB) {
      /* Compute the code for the block length */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_possLens[j])
          break;
      }
    } else {
      /*
       * Treat runs of 0 in a different way.
       * Compute the code for the block length.
       */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_posszLens[j])
          break;
      }
    }

    /* Writes the value of B and K */
    wt->bit_writer(__vseblocks_codeLogs[maxB], VSEBLOCKS_LOGLOG);
    wt->bit_writer(j, VSEBLOCKS_LOGLEN);
  }

  /* Align to 32-bit */
  wt->bit_flush();

  /* Finalization */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++)
    delete[] blocks[i];

  delete[] part;
  delete[] logs;

  size = wt->written;

  delete wt;
}